

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O0

void __thiscall FIX40::Message::Message(Message *this,MsgType *msgtype)

{
  allocator<char> local_99;
  STRING local_98;
  BeginString local_78;
  MsgType *local_18;
  MsgType *msgtype_local;
  Message *this_local;
  
  local_18 = msgtype;
  msgtype_local = (MsgType *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"FIX.4.0",&local_99);
  FIX::BeginString::BeginString(&local_78,&local_98);
  FIX::Message::Message(&this->super_Message,&local_78,local_18);
  FIX::BeginString::~BeginString(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  *(undefined ***)this = &PTR__Message_001b14b8;
  return;
}

Assistant:

Message( const FIX::MsgType& msgtype )
    : FIX::Message(
      FIX::BeginString("FIX.4.0"), msgtype )
     {}